

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::segmentcheck(string *unit,char closeSegment,size_t *index)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  char close;
  char current;
  size_t *index_local;
  char closeSegment_local;
  string *unit_local;
  
LAB_001978b6:
  do {
    while( true ) {
      while( true ) {
        uVar1 = *index;
        uVar4 = std::__cxx11::string::size();
        if (uVar4 <= uVar1) {
          return false;
        }
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)unit);
        cVar2 = *pcVar5;
        *index = *index + 1;
        if (cVar2 == closeSegment) {
          return true;
        }
        if ((cVar2 != '\"') && (cVar2 != '(')) break;
        cVar2 = getMatchCharacter(cVar2);
        bVar3 = segmentcheck(unit,cVar2,index);
        if (!bVar3) {
          return false;
        }
      }
      if (cVar2 == ')') {
        return false;
      }
      if (cVar2 != '[') break;
LAB_001979ae:
      cVar2 = getMatchCharacter(cVar2);
      if (cVar2 == closeSegment) {
        return false;
      }
      bVar3 = segmentcheck(unit,cVar2,index);
      if (!bVar3) {
        return false;
      }
    }
    if (cVar2 == '\\') {
      *index = *index + 1;
      goto LAB_001978b6;
    }
    if (cVar2 == ']') {
      return false;
    }
    if (cVar2 == '{') goto LAB_001979ae;
    if (cVar2 == '}') {
      return false;
    }
  } while( true );
}

Assistant:

static bool
    segmentcheck(const std::string& unit, char closeSegment, size_t& index)
{
    while (index < unit.size()) {
        char current = unit[index];
        ++index;
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '\\':
                ++index;
                break;
            case '(':
            case '"':
                if (!segmentcheck(unit, getMatchCharacter(current), index)) {
                    return false;
                }
                break;
            case '{':
            case '[': {
                auto close = getMatchCharacter(current);
                if (close == closeSegment) {
                    return false;
                }
                if (!segmentcheck(unit, close, index)) {
                    return false;
                }
                break;
            }
            case '}':
            case ')':
            case ']':
                return false;
            default:
                break;
        }
    }
    return false;
}